

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall Liby::Socket::createSocket(Socket *this)

{
  int iVar1;
  shared_ptr<Liby::FileDescriptor> local_20;
  Socket *local_10;
  Socket *this_local;
  
  iVar1 = 1;
  if ((this->isUdp_ & 1U) != 0) {
    iVar1 = 2;
  }
  local_10 = this;
  iVar1 = socket(2,iVar1,0);
  this->fd_ = iVar1;
  if (this->fd_ < 0) {
    throw_err();
  }
  std::make_shared<Liby::FileDescriptor,int&>((int *)&local_20);
  std::shared_ptr<Liby::FileDescriptor>::operator=(&this->fp_,&local_20);
  std::shared_ptr<Liby::FileDescriptor>::~shared_ptr(&local_20);
  return;
}

Assistant:

void Socket::createSocket() {
    fd_ = ::socket(AF_INET, isUdp_ ? SOCK_DGRAM : SOCK_STREAM, 0);
    if (fd_ < 0) {
        throw_err();
    }

    fp_ = std::make_shared<FileDescriptor>(fd_);
}